

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O1

FlagBase * __thiscall args::Group::Match(Group *this,EitherFlag *flag)

{
  pointer ppBVar1;
  int iVar2;
  undefined4 extraout_var;
  pointer ppBVar3;
  
  ppBVar3 = (this->children).super__Vector_base<args::Base_*,_std::allocator<args::Base_*>_>._M_impl
            .super__Vector_impl_data._M_start;
  ppBVar1 = (this->children).super__Vector_base<args::Base_*,_std::allocator<args::Base_*>_>._M_impl
            .super__Vector_impl_data._M_finish;
  while( true ) {
    if (ppBVar3 == ppBVar1) {
      return (FlagBase *)0x0;
    }
    iVar2 = (*(*ppBVar3)->_vptr_Base[7])(*ppBVar3,flag);
    if ((FlagBase *)CONCAT44(extraout_var,iVar2) != (FlagBase *)0x0) break;
    ppBVar3 = ppBVar3 + 1;
  }
  return (FlagBase *)CONCAT44(extraout_var,iVar2);
}

Assistant:

std::vector<std::string> MapKeysToStrings(const T &map)
        {
            std::vector<std::string> res;
            using K = typename std::decay<decltype(std::begin(map)->first)>::type;
            if (IsConvertableToString<K>::value)
            {
                for (const auto &p : map)
                {
                    res.push_back(detail::ToString(p.first));
                }

                std::sort(res.begin(), res.end());
            }
            return res;
        }